

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_until::translate_end
          (method_until *this,method_base *method,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *code)

{
  int iVar1;
  reference pptVar2;
  statement_base *psVar3;
  string *str;
  long *in_RSI;
  tree_type<cs::token_base_*> *in_stack_00000250;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_00000258;
  context_t *in_stack_00000260;
  method_loop *in_stack_00000268;
  size_type in_stack_ffffffffffffff78;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffff80;
  compile_error *this_00;
  undefined1 local_49 [73];
  
  if (in_RSI != (long *)0x0) {
    iVar1 = (**(code **)(*in_RSI + 0x18))();
    if (iVar1 == 0x11) {
      pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                          (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      token_expr::get_tree((token_expr *)*pptVar2);
      psVar3 = method_loop::translate
                         (in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250);
      return psVar3;
    }
  }
  str = (string *)__cxa_allocate_exception(0x28);
  this_00 = (compile_error *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_49 + 1),"Use until in non-loop statement.",(allocator *)this_00);
  compile_error::compile_error(this_00,str);
  __cxa_throw(str,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *method_until::translate_end(method_base *method, const context_t &context,
	        std::deque<std::deque<token_base *>> &raw,
	        std::deque<token_base *> &code)
	{
		if (method != nullptr && method->get_target_type() == statement_types::loop_)
			return static_cast<method_loop *>(method)->translate(context, raw,
			        static_cast<token_expr *>(code.at(1))->get_tree());
		else
			throw compile_error("Use until in non-loop statement.");
	}